

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_set_archive_flag.c
# Opt level: O3

int zip_set_archive_flag(zip_t *za,zip_flags_t flag,int value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  if (flag == 4) {
    iVar3 = 0x12;
  }
  else {
    uVar1 = za->ch_flags;
    uVar2 = ~flag & uVar1;
    if (value != 0) {
      uVar2 = uVar1 | flag;
    }
    if (uVar2 == uVar1) {
      return 0;
    }
    if ((za->flags & 2) == 0) {
      if ((((value == 0) || ((flag & 2) == 0)) || ((uVar1 & 2) != 0)) ||
         (iVar3 = _zip_changed(za,(zip_uint64_t *)0x0), iVar3 == 0)) {
        za->ch_flags = uVar2;
        return 0;
      }
      iVar3 = 0xf;
    }
    else {
      iVar3 = 0x19;
    }
  }
  zip_error_set(&za->error,iVar3,0);
  return -1;
}

Assistant:

ZIP_EXTERN int
zip_set_archive_flag(zip_t *za, zip_flags_t flag, int value) {
    unsigned int new_flags;

    if (flag == ZIP_AFL_IS_TORRENTZIP) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    /* TODO: when setting ZIP_AFL_WANT_TORRENTZIP, we should error out if any changes have been made that are not allowed for torrentzip. */

    if (value) {
        new_flags = za->ch_flags | flag;
    }
    else {
        new_flags = za->ch_flags & ~flag;
    }

    if (new_flags == za->ch_flags) {
        return 0;
    }

    /* Allow removing ZIP_AFL_RDONLY if manually set, not if archive was opened read-only. */
    if (za->flags & ZIP_AFL_RDONLY) {
        zip_error_set(&za->error, ZIP_ER_RDONLY, 0);
        return -1;
    }

    if ((flag & ZIP_AFL_RDONLY) && value && (za->ch_flags & ZIP_AFL_RDONLY) == 0) {
        if (_zip_changed(za, NULL)) {
            zip_error_set(&za->error, ZIP_ER_CHANGED, 0);
            return -1;
        }
    }

    za->ch_flags = new_flags;

    return 0;
}